

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  byte bVar11;
  stbtt__buf fontdict;
  float fVar12;
  stbtt_uint32 sVar13;
  ulong uVar14;
  int iVar15;
  int *piVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  uchar *puVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  uint uVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float dy2;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  stbtt__buf b;
  stbtt__buf sVar42;
  undefined1 in_stack_fffffffffffffd98 [12];
  int iVar43;
  stbtt__buf local_258;
  float local_244;
  uchar *puVar44;
  int iVar45;
  undefined4 uVar46;
  ulong local_230;
  float afStack_1d8 [2];
  stbtt_fontinfo *local_1d0;
  float s [48];
  undefined8 local_100;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  int *local_e0;
  stbtt__buf subr_stack [10];
  
  puVar44 = (info->subrs).data;
  local_100._0_4_ = (info->subrs).cursor;
  local_100._4_4_ = (info->subrs).size;
  local_258 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar20 = local_258._8_8_;
  uVar14 = uVar20 >> 0x20;
  if (local_258.size <= local_258.cursor) {
switchD_001aa9dd_default:
    return 0;
  }
  local_e0 = &(info->gsubrs).cursor;
  iVar43 = 1;
  iVar15 = 0;
  local_230 = 0;
  iVar45 = 0;
  uVar30 = 0;
  local_1d0 = info;
LAB_001aa742:
  dy2 = s[9];
  fVar12 = s[8];
  fVar39 = s[7];
  fVar35 = s[6];
  fVar38 = s[5];
  fVar37 = s[4];
  fVar36 = s[2];
  iVar17 = (int)uVar20;
  uVar20 = (long)iVar17 + 1;
  iVar22 = (int)uVar20;
  local_258.cursor = iVar22;
  bVar11 = local_258.data[iVar17];
  uVar34 = (uint)uVar30;
  iVar32 = (int)uVar14;
  iVar24 = (int)local_230;
  switch(bVar11) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    iVar15 = iVar15 + ((int)((int)(uVar30 >> 0x1f) + uVar34) >> 1);
    break;
  default:
    if (bVar11 < 0x20 && bVar11 != 0x1c) {
      return 0;
    }
    if (bVar11 == 0xff) {
      uVar18 = 0;
      iVar24 = 4;
      do {
        iVar22 = (int)uVar20;
        if (iVar22 < iVar32) {
          uVar20 = (ulong)(iVar22 + 1);
          uVar19 = (uint)local_258.data[iVar22];
        }
        else {
          uVar19 = 0;
        }
        uVar18 = uVar18 << 8 | uVar19;
        iVar24 = iVar24 + -1;
      } while (iVar24 != 0);
      local_258.cursor = (int)uVar20;
      fVar36 = (float)(int)uVar18 * 1.5258789e-05;
    }
    else {
      local_258.cursor = iVar17;
      if (iVar32 < iVar17) {
        local_258.cursor = iVar32;
      }
      if (iVar17 < 0) {
        local_258.cursor = iVar32;
      }
      sVar13 = stbtt__cff_int(&local_258);
      fVar36 = (float)(int)(short)sVar13;
    }
    if (0x2f < (int)uVar34) {
      return 0;
    }
    s[(int)uVar34] = fVar36;
    uVar31 = (ulong)(uVar34 + 1);
    goto LAB_001aae09;
  case 4:
    if ((int)uVar34 < 1) {
      return 0;
    }
    fVar37 = s[uVar34 - 1];
    fVar36 = 0.0;
    goto LAB_001aac40;
  case 5:
    if ((int)uVar34 < 2) {
      return 0;
    }
    uVar14 = 1;
    do {
      uVar2 = c->x;
      uVar7 = c->y;
      fVar36 = (float)uVar2 + (float)*(undefined8 *)(s + (uVar14 - 1));
      fVar37 = (float)uVar7 + (float)((ulong)*(undefined8 *)(s + (uVar14 - 1)) >> 0x20);
      c->x = fVar36;
      c->y = fVar37;
      uVar31 = 0;
      stbtt__csctx_v(c,'\x02',(int)fVar36,(int)fVar37,0,0,0,0);
      uVar14 = uVar14 + 2;
    } while (uVar14 < uVar30);
    goto LAB_001aae09;
  case 6:
    iVar32 = 0;
    if ((int)uVar34 < 1) {
      return 0;
    }
    for (; iVar32 < (int)uVar34; iVar32 = iVar32 + 1) {
      uVar4 = c->x;
      uVar9 = c->y;
      fVar36 = s[iVar32];
      c->x = fVar36 + (float)uVar4;
      c->y = (float)uVar9 + 0.0;
      stbtt__csctx_v(c,'\x02',(int)(fVar36 + (float)uVar4),(int)((float)uVar9 + 0.0),0,0,0,0);
      iVar32 = iVar32 + 1;
LAB_001ab3a9:
      if ((int)uVar34 <= iVar32) break;
      uVar5 = c->x;
      uVar10 = c->y;
      fVar36 = s[iVar32];
      c->x = (float)uVar5 + 0.0;
      c->y = fVar36 + (float)uVar10;
      stbtt__csctx_v(c,'\x02',(int)((float)uVar5 + 0.0),(int)(fVar36 + (float)uVar10),0,0,0,0);
    }
    break;
  case 7:
    iVar32 = 0;
    if (0 < (int)uVar34) goto LAB_001ab3a9;
    return 0;
  case 8:
    if ((int)uVar34 < 6) {
      return 0;
    }
    uVar14 = 5;
    do {
      stbtt__csctx_rccurve_to
                (c,afStack_1d8[uVar14 - 1],afStack_1d8[uVar14],afStack_1d8[uVar14 + 1],s[uVar14 - 2]
                 ,s[uVar14 - 1],s[uVar14]);
      uVar14 = uVar14 + 6;
    } while (uVar14 < uVar30);
    break;
  case 10:
    iVar32 = 1;
    if (iVar45 == 0) {
      uVar18 = (local_1d0->fdselect).size;
      if (uVar18 != 0) {
        puVar25 = (local_1d0->fdselect).data;
        uVar19 = 0;
        if ((int)uVar18 < 0) {
          uVar19 = uVar18;
        }
        if ((int)uVar18 < 1) {
LAB_001ab10a:
          uVar19 = uVar19 + glyph_index;
          uVar23 = uVar19;
          if ((int)uVar18 < (int)uVar19) {
            uVar23 = uVar18;
          }
          if ((int)uVar19 < 0) {
            uVar23 = uVar18;
          }
          uVar19 = 0;
          if ((int)uVar23 < (int)uVar18) {
            uVar19 = (uint)puVar25[(int)uVar23];
          }
LAB_001ab127:
          puVar25 = (local_1d0->cff).data;
          uVar46 = SUB84(puVar25,0);
          iVar45 = (int)((ulong)puVar25 >> 0x20);
          stbtt__cff_index_get(local_1d0->fontdicts,uVar19);
          sVar42.size = iVar43;
          sVar42.data = (uchar *)in_stack_fffffffffffffd98._0_8_;
          sVar42.cursor = in_stack_fffffffffffffd98._8_4_;
          fontdict.cursor = uVar46;
          fontdict.data = puVar44;
          fontdict.size = iVar45;
          sVar42 = stbtt__get_subrs(sVar42,fontdict);
        }
        else {
          if (puVar25[uVar19] == '\0') {
            uVar19 = 1;
            goto LAB_001ab10a;
          }
          if (puVar25[uVar19] == '\x03') {
            uVar23 = 0;
            iVar32 = 1;
            iVar45 = 2;
            do {
              if (iVar32 < (int)uVar18) {
                lVar29 = (long)iVar32;
                iVar32 = iVar32 + 1;
                uVar19 = (uint)puVar25[lVar29];
              }
              else {
                uVar19 = 0;
              }
              uVar23 = uVar23 << 8 | uVar19;
              iVar45 = iVar45 + -1;
            } while (iVar45 != 0);
            uVar26 = 0;
            iVar45 = 2;
            do {
              if (iVar32 < (int)uVar18) {
                lVar29 = (long)iVar32;
                iVar32 = iVar32 + 1;
                uVar19 = (uint)puVar25[lVar29];
              }
              else {
                uVar19 = 0;
              }
              uVar26 = uVar26 << 8 | uVar19;
              iVar45 = iVar45 + -1;
            } while (iVar45 != 0);
            if (0 < (int)uVar23) {
              uVar27 = 0;
              do {
                if (iVar32 < (int)uVar18) {
                  lVar29 = (long)iVar32;
                  iVar32 = iVar32 + 1;
                  uVar19 = (uint)puVar25[lVar29];
                }
                else {
                  uVar19 = 0;
                }
                uVar28 = 0;
                iVar45 = 2;
                do {
                  if (iVar32 < (int)uVar18) {
                    lVar29 = (long)iVar32;
                    iVar32 = iVar32 + 1;
                    uVar21 = (uint)puVar25[lVar29];
                  }
                  else {
                    uVar21 = 0;
                  }
                  uVar28 = uVar28 << 8 | uVar21;
                  iVar45 = iVar45 + -1;
                } while (iVar45 != 0);
                if (glyph_index < (int)uVar28 && (int)uVar26 <= glyph_index) goto LAB_001ab127;
                uVar27 = uVar27 + 1;
                uVar26 = uVar28;
              } while (uVar27 != uVar23);
            }
          }
          sVar42 = (stbtt__buf)ZEXT816(0);
        }
        puVar44 = sVar42.data;
        iVar32 = 1;
        local_100 = sVar42._8_8_;
      }
    }
    goto LAB_001ab175;
  case 0xb:
    if (iVar24 < 1) {
      return 0;
    }
    local_230 = (ulong)(iVar24 - 1);
    local_258.data._4_4_ = *(undefined4 *)((long)&subr_stack[local_230].data + 4);
    local_258.data._0_4_ = *(undefined4 *)&subr_stack[local_230].data;
    local_258.cursor = subr_stack[local_230].cursor;
    local_258.size = subr_stack[local_230].size;
    uVar31 = uVar30;
    goto LAB_001aae09;
  case 0xc:
    if (iVar32 <= iVar22) {
      return 0;
    }
    local_258.cursor = iVar17 + 2;
    switch(local_258.data[uVar20]) {
    case '\"':
      if ((int)uVar34 < 7) {
        return 0;
      }
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      dy2 = -fVar36;
      fVar39 = 0.0;
      fVar36 = 0.0;
      break;
    case '#':
      if ((int)uVar34 < 0xd) {
        return 0;
      }
      local_f8 = s[10];
      local_244 = s[0xb];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar37 = fVar35;
      fVar36 = local_244;
      fVar38 = fVar12;
      fVar35 = local_f8;
      break;
    case '$':
      if ((int)uVar34 < 9) {
        return 0;
      }
      local_f8 = s[1];
      uStack_f4 = 0;
      uStack_f0 = 0;
      uStack_ec = 0;
      local_244 = s[3];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      fVar37 = fVar38;
      dy2 = fVar39;
      fVar36 = -(local_f8 + local_244 + fVar39);
      fVar38 = fVar35;
      fVar39 = 0.0;
      fVar35 = fVar12;
      break;
    case '%':
      if ((int)uVar34 < 0xb) {
        return 0;
      }
      fVar36 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar38 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar37 = ABS(fVar36);
      fVar40 = ABS(fVar38);
      fVar41 = s[10];
      if (fVar37 <= fVar40) {
        fVar41 = -fVar36;
      }
      uVar34 = -(uint)(fVar40 < fVar37);
      uVar18 = ~uVar34 & (uint)s[10];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar37 = fVar35;
      fVar36 = (float)(uVar18 | (uint)-fVar38 & uVar34);
      fVar38 = fVar12;
      fVar35 = fVar41;
      break;
    default:
      goto switchD_001aa9dd_default;
    }
    goto LAB_001aab5f;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (iVar43 != 0) {
      iVar15 = iVar15 + ((int)((int)(uVar30 >> 0x1f) + uVar34) >> 1);
    }
    iVar43 = iVar15 + 0xe;
    if (-1 < iVar15 + 7) {
      iVar43 = iVar15 + 7;
    }
    iVar22 = (iVar43 >> 3) + iVar22;
    local_258.cursor = iVar22;
    if (iVar32 < iVar22) {
      local_258.cursor = iVar32;
    }
    if (iVar22 < 0) {
      local_258.cursor = iVar32;
    }
    goto LAB_001aadfe;
  case 0x15:
    if ((int)uVar34 < 2) {
      return 0;
    }
    fVar36 = s[uVar34 - 2];
    fVar37 = s[uVar34 - 1];
    goto LAB_001aac40;
  case 0x16:
    if ((int)uVar34 < 1) {
      return 0;
    }
    fVar36 = s[uVar34 - 1];
    fVar37 = 0.0;
LAB_001aac40:
    stbtt__csctx_rmove_to(c,fVar36,fVar37);
LAB_001aadfe:
    iVar43 = 0;
    break;
  case 0x18:
    if ((int)uVar34 < 8) {
      return 0;
    }
    lVar29 = -6;
    do {
      lVar33 = lVar29;
      stbtt__csctx_rccurve_to
                (c,s[lVar33 + 6],s[lVar33 + 7],s[lVar33 + 8],s[lVar33 + 9],s[lVar33 + 10],
                 s[lVar33 + 0xb]);
      lVar29 = lVar33 + 6;
    } while (lVar33 + 6 < (long)(uVar30 - 0xd));
    if ((int)uVar34 <= (int)lVar33 + 0xd) {
      return 0;
    }
    uVar1 = c->x;
    uVar6 = c->y;
    fVar36 = (float)uVar1 + (float)*(undefined8 *)(s + lVar33 + 0xc);
    fVar37 = (float)uVar6 + (float)((ulong)*(undefined8 *)(s + lVar33 + 0xc) >> 0x20);
    c->x = fVar36;
    c->y = fVar37;
    stbtt__csctx_v(c,'\x02',(int)fVar36,(int)fVar37,0,0,0,0);
    uVar31 = 0;
    goto LAB_001aae09;
  case 0x19:
    if ((int)uVar34 < 8) {
      return 0;
    }
    uVar14 = 2;
    do {
      uVar20 = uVar14;
      uVar3 = c->x;
      uVar8 = c->y;
      fVar36 = (float)uVar3 + (float)*(undefined8 *)(s + (uVar20 - 2));
      fVar37 = (float)uVar8 + (float)((ulong)*(undefined8 *)(s + (uVar20 - 2)) >> 0x20);
      c->x = fVar36;
      c->y = fVar37;
      stbtt__csctx_v(c,'\x02',(int)fVar36,(int)fVar37,0,0,0,0);
      uVar14 = uVar20 + 2;
    } while (uVar20 + 1 < (ulong)(uVar34 - 6));
    if ((int)uVar34 <= (int)(uVar20 + 5)) {
      return 0;
    }
    fVar37 = s[uVar20];
    dy2 = s[(int)uVar14 + 1];
    fVar36 = s[uVar20 + 5 & 0xffffffff];
    fVar38 = s[uVar14 & 0xffffffff];
    fVar39 = s[uVar20 + 1];
    fVar35 = s[(int)uVar14 + 2];
LAB_001aab5f:
    stbtt__csctx_rccurve_to(c,fVar37,fVar39,fVar38,dy2,fVar35,fVar36);
    break;
  case 0x1a:
  case 0x1b:
    if ((int)uVar34 < 4) {
      return 0;
    }
    uVar14 = (ulong)(uVar34 & 1);
    if ((uVar34 & 1) + 3 < uVar34) {
      fVar36 = 0.0;
      if ((uVar30 & 1) != 0) {
        fVar36 = s[0];
      }
      do {
        iVar32 = (int)uVar14;
        fVar37 = s[uVar14];
        if (bVar11 == 0x1b) {
          fVar35 = fVar37;
          fVar39 = 0.0;
          fVar38 = s[iVar32 + 3];
          fVar37 = fVar36;
        }
        else {
          fVar38 = 0.0;
          fVar35 = fVar36;
          fVar39 = s[iVar32 + 3];
        }
        stbtt__csctx_rccurve_to(c,fVar35,fVar37,s[uVar14 + 1],s[uVar14 + 2],fVar38,fVar39);
        uVar14 = uVar14 + 4;
        fVar36 = 0.0;
      } while (iVar32 + 7 < (int)uVar34);
    }
    break;
  case 0x1d:
    iVar32 = iVar45;
LAB_001ab175:
    if ((int)uVar34 < 1) {
      return 0;
    }
    if (9 < iVar24) {
      return 0;
    }
    fVar36 = s[uVar34 - 1];
    *(undefined4 *)&subr_stack[iVar24].data = local_258.data._0_4_;
    *(undefined4 *)((long)&subr_stack[iVar24].data + 4) = local_258.data._4_4_;
    subr_stack[iVar24].cursor = local_258.cursor;
    subr_stack[iVar24].size = local_258.size;
    piVar16 = (int *)&local_100;
    puVar25 = puVar44;
    if (bVar11 != 10) {
      puVar25 = (local_1d0->gsubrs).data;
      piVar16 = local_e0;
    }
    local_230 = (ulong)(iVar24 + 1);
    uVar19 = (uint)(*(ulong *)piVar16 >> 0x20);
    uVar23 = (int)uVar19 >> 0x1f & uVar19;
    uVar18 = 0;
    iVar45 = 2;
    do {
      if ((int)uVar23 < (int)uVar19) {
        lVar29 = (long)(int)uVar23;
        uVar23 = uVar23 + 1;
        uVar26 = (uint)puVar25[lVar29];
      }
      else {
        uVar26 = 0;
      }
      uVar18 = uVar18 << 8 | uVar26;
      iVar45 = iVar45 + -1;
    } while (iVar45 != 0);
    uVar19 = (uint)(0x4d7 < (int)uVar18) << 10 | 0x6b;
    if (0x846b < (int)uVar18) {
      uVar19 = 0x8000;
    }
    iVar45 = uVar19 + (int)fVar36;
    sVar42 = (stbtt__buf)ZEXT816(0);
    if (iVar45 < (int)uVar18 && -1 < iVar45) {
      b._8_8_ = (ulong)uVar23 | *(ulong *)piVar16 & 0xffffffff00000000;
      b.data = puVar25;
      sVar42 = stbtt__cff_index_get(b,iVar45);
    }
    if (sVar42._8_8_ >> 0x20 == 0) {
      return 0;
    }
    local_258.size = sVar42.size;
    local_258.data = sVar42.data;
    local_258.cursor = 0;
    uVar31 = (ulong)(uVar34 - 1);
    iVar45 = iVar32;
    goto LAB_001aae09;
  case 0x1e:
    iVar24 = 0;
    if ((int)uVar34 < 4) {
      return 0;
    }
    while (iVar24 + 3 < (int)uVar34) {
      iVar32 = iVar24 + 4;
      fVar36 = 0.0;
      if (uVar34 - iVar24 == 5) {
        fVar36 = s[iVar32];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar24],s[(long)iVar24 + 1],s[(long)iVar24 + 2],s[iVar24 + 3],fVar36);
LAB_001ab2fa:
      if ((int)uVar34 <= iVar32 + 3) break;
      iVar24 = iVar32 + 4;
      fVar36 = 0.0;
      if (uVar34 - iVar32 == 5) {
        fVar36 = s[iVar24];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar32],0.0,s[(long)iVar32 + 1],s[(long)iVar32 + 2],fVar36,s[iVar32 + 3]);
    }
    break;
  case 0x1f:
    iVar32 = 0;
    if (3 < (int)uVar34) goto LAB_001ab2fa;
    return 0;
  }
  uVar31 = 0;
LAB_001aae09:
  uVar20 = (ulong)(uint)local_258.cursor;
  uVar14 = (ulong)(uint)local_258.size;
  uVar30 = uVar31;
  if (local_258.size <= local_258.cursor) {
    return 0;
  }
  goto LAB_001aa742;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // FALLTHROUGH
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && b0 < 32)
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}